

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

void CSOAA::output_rank_example(vw *all,example *head_ec,bool *hit_loss,multi_ex *ec_seq)

{
  uint64_t *puVar1;
  int iVar2;
  wclass *pwVar3;
  wclass *pwVar4;
  pointer ppeVar5;
  pointer ppeVar6;
  int *piVar7;
  _func_void_int_string_v_array<char> *p_Var8;
  double dVar9;
  v_array<char> vVar10;
  bool bVar11;
  char cVar12;
  ostream *poVar13;
  long lVar14;
  float *pfVar15;
  byte bVar16;
  ulong uVar17;
  multi_ex *__range2;
  int *piVar18;
  long lVar19;
  float fVar20;
  string outputString;
  stringstream outputStringStream;
  undefined1 in_stack_fffffffffffffdd8 [15];
  char in_stack_fffffffffffffde7;
  vw *all_00;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pwVar3 = (head_ec->l).cs.costs._begin;
  pwVar4 = (head_ec->l).cs.costs._end;
  if ((((head_ec->tag)._end != (head_ec->tag)._begin) ||
      ((head_ec->super_example_predict).indices._end !=
       (head_ec->super_example_predict).indices._begin)) &&
     (bVar11 = ec_is_label_definition(head_ec), !bVar11)) {
    puVar1 = &all->sd->total_features;
    *puVar1 = *puVar1 + head_ec->num_features;
    all_00 = all;
    cVar12 = (*(code *)PTR_test_label_002e1b20)();
    if (cVar12 == '\0') {
      ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppeVar6 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppeVar5 == ppeVar6) {
        dVar9 = 0.0;
      }
      else {
        bVar16 = *hit_loss;
        fVar20 = 0.0;
        lVar14 = 0;
        uVar17 = 0;
        do {
          if ((bVar16 & 1) != 0) break;
          if (uVar17 == ((head_ec->pred).a_s._begin)->action) {
            fVar20 = ((ppeVar5[uVar17]->l).cs.costs._begin)->x;
            *hit_loss = true;
            bVar16 = 1;
          }
          uVar17 = uVar17 + 1;
          lVar19 = lVar14 + 8;
          lVar14 = lVar14 + 8;
        } while ((pointer)((long)ppeVar5 + lVar19) != ppeVar6);
        dVar9 = (double)fVar20;
      }
      all->sd->sum_loss = all->sd->sum_loss + dVar9;
      all->sd->sum_loss_since_last_dump = dVar9 + all->sd->sum_loss_since_last_dump;
    }
    piVar7 = (all->final_prediction_sink)._end;
    for (piVar18 = (all->final_prediction_sink)._begin; piVar18 != piVar7; piVar18 = piVar18 + 1) {
      ACTION_SCORE::print_action_score
                (*piVar18,(v_array<ACTION_SCORE::action_score> *)&(head_ec->pred).scalars,
                 &head_ec->tag);
    }
    if (0 < all_00->raw_prediction) {
      local_1f8 = local_1e8;
      local_1f0 = 0;
      local_1e8[0] = 0;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)&local_1f8,_S_out|_S_in);
      lVar14 = (long)pwVar4 - (long)pwVar3;
      if (lVar14 != 0) {
        lVar14 = lVar14 >> 4;
        pfVar15 = &pwVar3->partial_prediction;
        lVar19 = 0;
        do {
          if (lVar19 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,&stack0xfffffffffffffde7,1);
          }
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          in_stack_fffffffffffffde7 = ':';
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,&stack0xfffffffffffffde7,1);
          std::ostream::_M_insert<double>((double)*pfVar15);
          lVar19 = lVar19 + 1;
          pfVar15 = pfVar15 + 4;
        } while (lVar14 + (ulong)(lVar14 == 0) != lVar19);
      }
      p_Var8 = all_00->print_text;
      iVar2 = all_00->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar10._end._7_1_ = in_stack_fffffffffffffde7;
      vVar10._0_15_ = in_stack_fffffffffffffdd8;
      vVar10.end_array = (char *)ec_seq;
      vVar10.erase_count = (size_t)all_00;
      (*p_Var8)(iVar2,(string)head_ec->tag,vVar10);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8);
      }
    }
    bVar11 = (bool)(*(code *)PTR_test_label_002e1b20)(&head_ec->l);
    COST_SENSITIVE::print_update(all_00,bVar11,head_ec,ec_seq,true,0);
  }
  return;
}

Assistant:

void output_rank_example(vw& all, example& head_ec, bool& hit_loss, multi_ex* ec_seq)
{
  label& ld = head_ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(head_ec))
    return;
  if (ec_is_label_definition(head_ec))
    return;

  all.sd->total_features += head_ec.num_features;

  float loss = 0.;
  v_array<action_score>& preds = head_ec.pred.a_s;

  if (!COST_SENSITIVE::cs_label.test_label(&head_ec.l))
  {
    size_t idx = 0;
    for (example* ex : *ec_seq)
    {
      if (hit_loss)
        break;
      if (preds[0].action == idx)
      {
        loss = ex->l.cs.costs[0].x;
        hit_loss = true;
      }
      idx++;
    }
    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
    assert(loss >= 0);
  }

  for (int sink : all.final_prediction_sink) print_action_score(sink, head_ec.pred.a_s, head_ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    // outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), head_ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&head_ec.l), head_ec, ec_seq, true, 0);
}